

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O2

json_t * pack_object_inter(scanner_t *s,va_list *ap,int need_incref)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  undefined7 uVar4;
  int iVar5;
  json_t *pjVar6;
  long *plVar7;
  
  next_token(s);
  cVar1 = (s->token).token;
  if ((cVar1 != '*') && (cVar1 != '?')) {
    uVar4 = *(undefined7 *)&(s->token).field_0x11;
    (s->next_token).token = (s->token).token;
    *(undefined7 *)&(s->next_token).field_0x11 = uVar4;
    iVar5 = (s->token).column;
    sVar3 = (s->token).pos;
    (s->next_token).line = (s->token).line;
    (s->next_token).column = iVar5;
    (s->next_token).pos = sVar3;
    iVar5 = (s->prev_token).column;
    sVar3 = (s->prev_token).pos;
    (s->token).line = (s->prev_token).line;
    (s->token).column = iVar5;
    (s->token).pos = sVar3;
    uVar4 = *(undefined7 *)&(s->prev_token).field_0x11;
    (s->token).token = (s->prev_token).token;
    *(undefined7 *)&(s->token).field_0x11 = uVar4;
  }
  uVar2 = (*ap)[0].gp_offset;
  if ((ulong)uVar2 < 0x29) {
    plVar7 = (long *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
    (*ap)[0].gp_offset = uVar2 + 8;
  }
  else {
    plVar7 = (long *)(*ap)[0].overflow_arg_area;
    (*ap)[0].overflow_arg_area = plVar7 + 1;
  }
  pjVar6 = (json_t *)*plVar7;
  if (pjVar6 == (json_t *)0x0) {
    if (cVar1 == '*') {
      pjVar6 = (json_t *)0x0;
    }
    else {
      if (cVar1 == '?') {
        pjVar6 = json_null();
        return pjVar6;
      }
      pjVar6 = (json_t *)0x0;
      set_error(s,"<args>",json_error_null_value,"NULL object");
      s->has_error = 1;
    }
  }
  return pjVar6;
}

Assistant:

static json_t *pack_object_inter(scanner_t *s, va_list *ap, int need_incref) {
    json_t *json;
    char ntoken;

    next_token(s);
    ntoken = token(s);

    if (ntoken != '?' && ntoken != '*')
        prev_token(s);

    json = va_arg(*ap, json_t *);

    if (json)
        return need_incref ? json_incref(json) : json;

    switch (ntoken) {
        case '?':
            return json_null();
        case '*':
            return NULL;
        default:
            break;
    }

    set_error(s, "<args>", json_error_null_value, "NULL object");
    s->has_error = 1;
    return NULL;
}